

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableArgumentsArrayWalker::FetchFormalsAddress
          (RecyclableArgumentsArrayWalker *this,LocalsWalker *localsWalker)

{
  code *pcVar1;
  uint uVar2;
  FunctionBody *this_00;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptFunction *this_01;
  PropertyIdArray **ppPVar5;
  PropertyIdArray *pPVar6;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  IDiagObjectAddress *local_38;
  IDiagObjectAddress *address;
  bool isConst;
  PropertyIdOnRegSlotsContainer *pPStack_28;
  uint32 i;
  PropertyIdOnRegSlotsContainer *container;
  FunctionBody *pFBody;
  LocalsWalker *localsWalker_local;
  RecyclableArgumentsArrayWalker *this_local;
  
  pFBody = (FunctionBody *)localsWalker;
  localsWalker_local = (LocalsWalker *)this;
  if (localsWalker == (LocalsWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc38,"(localsWalker)","localsWalker");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((pFBody->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.ptr ==
      (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc39,"(localsWalker->pFrame)","localsWalker->pFrame");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_01 = (JavascriptFunction *)
            (**(code **)(*(long *)(pFBody->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs.
                                  ptr + 0x10))();
  container = (PropertyIdOnRegSlotsContainer *)JavascriptFunction::GetFunctionBody(this_01);
  if ((FunctionBody *)container == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc3b,"(pFBody)","pFBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPStack_28 = FunctionBody::GetPropertyIdOnRegSlotsContainer((FunctionBody *)container);
  if ((pPStack_28 != (PropertyIdOnRegSlotsContainer *)0x0) &&
     (ppPVar5 = Memory::WriteBarrierPtr::operator_cast_to_PropertyIdArray__
                          ((WriteBarrierPtr *)&pPStack_28->propertyIdsForFormalArgs),
     *ppPVar5 != (PropertyIdArray *)0x0)) {
    for (address._4_4_ = 0; uVar2 = address._4_4_,
        pPVar6 = Memory::WriteBarrierPtr<Js::PropertyIdArray>::operator->
                           (&pPStack_28->propertyIdsForFormalArgs), uVar2 < pPVar6->count;
        address._4_4_ = address._4_4_ + 1) {
      pPVar6 = Memory::WriteBarrierPtr<Js::PropertyIdArray>::operator->
                         (&pPStack_28->propertyIdsForFormalArgs);
      this_00 = pFBody;
      if ((&pPVar6[1].count)[address._4_4_] != 0xffffffff) {
        address._3_1_ = 0;
        pPVar6 = Memory::WriteBarrierPtr<Js::PropertyIdArray>::operator->
                           (&pPStack_28->propertyIdsForFormalArgs);
        local_38 = LocalsWalker::FindPropertyAddress
                             ((LocalsWalker *)this_00,(&pPVar6[1].count)[address._4_4_],false,
                              (bool *)((long)&address + 3));
        if (local_38 != (IDiagObjectAddress *)0x0) {
          if (this->pFormalsList ==
              (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)0x0) {
            alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                        super_RecyclableObjectWalker.scriptContext);
            pLVar7 = JsUtil::
                     List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ::New(alloc,4);
            this->pFormalsList = pLVar7;
          }
          JsUtil::
          List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this->pFormalsList,&local_38);
        }
      }
    }
  }
  return;
}

Assistant:

void RecyclableArgumentsArrayWalker::FetchFormalsAddress(LocalsWalker * localsWalker)
    {
        Assert(localsWalker);
        Assert(localsWalker->pFrame);
        Js::FunctionBody *pFBody = localsWalker->pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        PropertyIdOnRegSlotsContainer * container = pFBody->GetPropertyIdOnRegSlotsContainer();
        if (container &&  container->propertyIdsForFormalArgs)
        {
            for (uint32 i = 0; i < container->propertyIdsForFormalArgs->count; i++)
            {
                if (container->propertyIdsForFormalArgs->elements[i] != Js::Constants::NoRegister)
                {
                    bool isConst = false;
                    IDiagObjectAddress * address = localsWalker->FindPropertyAddress(container->propertyIdsForFormalArgs->elements[i], false, isConst);
                    if (address)
                    {
                        if (pFormalsList == nullptr)
                        {
                            pFormalsList = JsUtil::List<IDiagObjectAddress *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
                        }

                        pFormalsList->Add(address);
                    }
                }
            }
        }
    }